

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O2

IntrinsicResult intrinsic_chdir(Context *context,IntrinsicResult partialResult)

{
  int iVar1;
  bool b;
  Value path;
  Value local_58;
  String pathStr;
  Value local_38;
  String local_28;
  
  MiniScript::String::String(&local_28,"path");
  MiniScript::Context::GetVar((Context *)&path,(String *)partialResult.rs,(LocalOnlyMode)&local_28);
  MiniScript::String::release(&local_28);
  if (path.type == Null) {
    MiniScript::Value::Value(&local_38,(Value *)MiniScript::Value::zero);
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_38,true);
    MiniScript::Value::~Value(&local_38);
  }
  else {
    MiniScript::Value::ToString((Value *)&pathStr,(Machine *)&path);
    if ((pathStr.ss == (StringStorage *)0x0) || ((pathStr.ss)->dataSize < 2)) {
      b = false;
    }
    else {
      iVar1 = chdir((pathStr.ss)->data);
      b = iVar1 == 0;
    }
    MiniScript::Value::Truth(&local_58,b);
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_58,true);
    MiniScript::Value::~Value(&local_58);
    MiniScript::String::release(&pathStr);
  }
  MiniScript::Value::~Value(&path);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_chdir(Context *context, IntrinsicResult partialResult) {
	Value path = context->GetVar("path");
	if (path.IsNull()) return IntrinsicResult(Value::zero);
	String pathStr = path.ToString();
	bool ok = false;
	if (!pathStr.empty()) {
		if (chdir(pathStr.c_str()) == 0) ok = true;
	}
	return IntrinsicResult(Value::Truth(ok));
}